

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void ar_exec(ar_object obj,double *inp)

{
  int N;
  int p;
  int iVar1;
  double *hess;
  double dVar2;
  double dVar3;
  double local_40;
  ar_object local_38;
  
  N = obj->N;
  p = ar_estimate(inp,N,obj->method);
  obj->p = p;
  iVar1 = obj->method;
  if (iVar1 == 0) {
    dVar2 = mean(inp,N);
    obj->mean = dVar2;
    ywalg2(inp,N,p,(double *)(obj + 1),&obj->var);
  }
  else if (iVar1 == 1) {
    dVar2 = mean(inp,N);
    obj->mean = dVar2;
    burgalg(inp,N + -1,p,(double *)(obj + 1),&obj->var);
  }
  else if (iVar1 == 2) {
    hess = (double *)malloc((long)(p + 1) * (long)(p + 1) * 8);
    local_38 = obj + 1;
    iVar1 = as154(inp,obj->N,obj->optmethod,p,0,0,(double *)local_38,(double *)0x0,&obj->mean,
                  &obj->var,(double *)(&obj[1].N + (long)p * 2),&local_40,hess,0);
    obj->retval = iVar1;
    dVar3 = (local_40 + local_40 + 1.0 + 1.8378762217451237) * (double)N * -0.5;
    dVar2 = (double)(obj->p + 1);
    obj->aic = ((dVar2 + dVar2) - (dVar3 + dVar3)) + 2.0;
    free(hess);
  }
  obj->order = obj->p;
  return;
}

Assistant:

void ar_exec(ar_object obj, double *inp) {
	int p, N;
	double loglik;
	double *hess;
	N = obj->N;

	obj->p = ar_estimate(inp, N, obj->method);
	//printf("\n p %d \n", obj->p);
	p = obj->p;
	int cssml = 0;

	if (obj->method == 2) {
		hess = (double*)malloc(sizeof(double)* (p + 1) * (p + 1));
		obj->retval = as154(inp, obj->N, obj->optmethod, obj->p, 0, 0 , obj->params, NULL, &obj->mean, &obj->var, obj->params + p, &loglik,
			hess,cssml);
		loglik = -0.5 * (N * (2 * loglik + 1.0 + log(2 * 3.14159)));
		obj->aic = -2.0 * loglik + 2.0 * (obj->p + 1) + 2.0;
		free(hess);
	}
	else if (obj->method == 0) {
		obj->mean = mean(inp, N);
		ywalg2(inp, N, p, obj->params, &obj->var);
	}
	else if (obj->method == 1) {
		obj->mean = mean(inp, N);
		burgalg(inp, N - 1, p, obj->params, &obj->var);
	}

	obj->order = obj->p;


}